

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

ScopedElement * __thiscall
doctest::anon_unknown_15::XmlWriter::ScopedElement::writeText
          (ScopedElement *this,string *text,bool indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  XmlWriter *this_00;
  ostream *os;
  pointer pcVar3;
  XmlEncode local_58;
  
  if (text->_M_string_length != 0) {
    this_00 = this->m_writer;
    bVar2 = this_00->m_tagIsOpen;
    ensureTagClosed(this_00);
    if ((indent & bVar2) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this_00->m_os,(this_00->m_indent)._M_dataplus._M_p,
                 (this_00->m_indent)._M_string_length);
    }
    os = this_00->m_os;
    paVar1 = &local_58.m_str.field_2;
    pcVar3 = (text->_M_dataplus)._M_p;
    local_58.m_str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + text->_M_string_length);
    local_58.m_forWhat = ForTextNodes;
    operator<<(os,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.m_str._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.m_str._M_dataplus._M_p,
                      local_58.m_str.field_2._M_allocated_capacity + 1);
    }
    this_00->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::writeText( std::string const& text, bool indent ) {
        m_writer->writeText( text, indent );
        return *this;
    }